

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_IsExtensible(JSContext *ctx,JSValue obj)

{
  int iVar1;
  int iVar2;
  JSProxyData *argv;
  uint uVar3;
  JSValue JVar4;
  JSValueUnion local_30;
  int64_t local_28;
  
  if ((int)obj.tag == -1) {
    if (*(short *)((long)obj.u.ptr + 6) == 0x29) {
      argv = get_proxy_method(ctx,(JSValue *)&local_30,obj,0x61);
      if (argv != (JSProxyData *)0x0) {
        if ((int)local_28 == 3) {
          iVar1 = JS_IsExtensible(ctx,argv->target);
          return iVar1;
        }
        JVar4.tag = local_28;
        JVar4.u.float64 = local_30.float64;
        JVar4 = JS_CallFree(ctx,JVar4,argv->handler,1,&argv->target);
        if ((int)JVar4.tag != 6) {
          iVar1 = JS_ToBoolFree(ctx,JVar4);
          iVar2 = JS_IsExtensible(ctx,argv->target);
          if (-1 < iVar2) {
            if (iVar1 == iVar2) {
              return iVar1;
            }
            JS_ThrowTypeError(ctx,"proxy: inconsistent isExtensible");
          }
        }
      }
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = *(byte *)((long)obj.u.ptr + 5) & 1;
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int JS_IsExtensible(JSContext *ctx, JSValueConst obj)
{
    JSObject *p;

    if (unlikely(JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (unlikely(p->class_id == JS_CLASS_PROXY))
        return js_proxy_isExtensible(ctx, obj);
    else
        return p->extensible;
}